

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O2

SQInteger debug_getbuildinfo(HSQUIRRELVM v)

{
  sq_newtable(v);
  sq_pushstring(v,"version",-1);
  sq_pushstring(v,"4.8.0",-1);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"charsize",-1);
  sq_pushinteger(v,1);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"intsize",-1);
  sq_pushinteger(v,8);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"floatsize",-1);
  sq_pushinteger(v,4);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"gc",-1);
  sq_pushstring(v,"enabled",-1);
  sq_newslot(v,-3,0);
  return 1;
}

Assistant:

static SQInteger debug_getbuildinfo(HSQUIRRELVM v)
{
  sq_newtable(v);
  sq_pushstring(v, _SC("version"), -1);
  sq_pushstring(v, SQUIRREL_VERSION, -1);
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("charsize"), -1);
  sq_pushinteger(v, sizeof(SQChar));
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("intsize"), -1);
  sq_pushinteger(v, sizeof(SQInteger));
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("floatsize"), -1);
  sq_pushinteger(v, sizeof(SQFloat));
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("gc"), -1);
#ifndef NO_GARBAGE_COLLECTOR
  sq_pushstring(v, _SC("enabled"), -1);
#else
  sq_pushstring(v, _SC("disabled"), -1);
#endif // NO_GARBAGE_COLLECTOR
  sq_newslot(v, -3, SQFalse);
  return 1;
}